

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,string *str)

{
  string *psVar1;
  char *pcVar2;
  anon_class_8_1_ba1d7991 local_38;
  int local_2c;
  string *local_28;
  string *str_local;
  char *pcStack_18;
  int size_local;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  local_28 = str;
  str_local._4_4_ = size;
  pcStack_18 = ptr;
  ptr_local = (char *)this;
  std::__cxx11::string::clear();
  psVar1 = local_28;
  if ((long)str_local._4_4_ <= (long)(this->buffer_end_ + ((long)this->limit_ - (long)pcStack_18)))
  {
    std::__cxx11::string::size();
    local_2c = 50000000;
    std::min<int>((int *)((long)&str_local + 4),&local_2c);
    std::__cxx11::string::reserve((ulong)psVar1);
  }
  local_38.str = local_28;
  pcVar2 = AppendSize<google::protobuf::internal::EpsCopyInputStream::ReadStringFallback(char_const*,int,std::__cxx11::string*)::__0>
                     (this,pcStack_18,str_local._4_4_,&local_38);
  return pcVar2;
}

Assistant:

const char* EpsCopyInputStream::ReadStringFallback(const char* ptr, int size,
                                                   std::string* str) {
  str->clear();
  if (PROTOBUF_PREDICT_TRUE(size <= buffer_end_ - ptr + limit_)) {
    // Reserve the string up to a static safe size. If strings are bigger than
    // this we proceed by growing the string as needed. This protects against
    // malicious payloads making protobuf hold on to a lot of memory.
    str->reserve(str->size() + std::min<int>(size, kSafeStringSize));
  }
  return AppendSize(ptr, size,
                    [str](const char* p, int s) { str->append(p, s); });
}